

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O2

void __thiscall
DynamicGraph::updateVisitedComponents
          (DynamicGraph *this,list<unsigned_long,_std::allocator<unsigned_long>_> *visited)

{
  pointer puVar1;
  unsigned_long uVar2;
  _List_node_base *p_Var3;
  
  puVar1 = (this->components).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = this->nextComponent + 1;
  this->nextComponent = uVar2;
  p_Var3 = (_List_node_base *)visited;
  while (p_Var3 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var3->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)visited) {
    puVar1[(long)p_Var3[1]._M_next] = uVar2;
  }
  return;
}

Assistant:

void DynamicGraph::updateVisitedComponents(const std::list<Vertex>& visited)
{
    this->nextComponent++;
    for (unsigned long v : visited) {
        this->components[v] = this->nextComponent;
    }
}